

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateManager.cpp
# Opt level: O3

data_view * __thiscall
helics::ValueFederateManager::getValue
          (data_view *__return_storage_ptr__,ValueFederateManager *this,Input *inp)

{
  void *pvVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  char *pcVar3;
  
  pvVar1 = inp->dataReference;
  if (pvVar1 == (void *)0x0) {
    (__return_storage_ptr__->ref).
    super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (__return_storage_ptr__->ref).
    super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->dblock)._M_len = 0;
    (__return_storage_ptr__->dblock)._M_str = (char *)0x0;
  }
  else {
    *(baseType *)((long)pvVar1 + 0x30) = (this->CurrentTime).internalTimeCode;
    *(undefined1 *)((long)pvVar1 + 0xe0) = 0;
    pcVar3 = *(char **)((long)pvVar1 + 0x10);
    (__return_storage_ptr__->dblock)._M_len = *(size_t *)((long)pvVar1 + 8);
    (__return_storage_ptr__->dblock)._M_str = pcVar3;
    (__return_storage_ptr__->ref).
    super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         *(element_type **)((long)pvVar1 + 0x18);
    p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)pvVar1 + 0x20);
    (__return_storage_ptr__->ref).
    super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         p_Var2;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded != '\0') {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        return __return_storage_ptr__;
      }
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
      return __return_storage_ptr__;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

data_view ValueFederateManager::getValue(const Input& inp)
{
    auto* iData = static_cast<InputData*>(inp.dataReference);
    if (iData != nullptr) {
        iData->lastQuery = CurrentTime;
        iData->hasUpdate = false;
        return iData->lastData;
    }
    return data_view();
}